

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int gost_imit_final(EVP_MD_CTX *ctx,uchar *md)

{
  int iVar1;
  ossl_gost_imit_ctx *c;
  uchar buffer [8];
  undefined8 local_20;
  
  c = (ossl_gost_imit_ctx *)EVP_MD_CTX_get0_md_data();
  if (c->key_set == 0) {
    ERR_GOST_error(0x72,0x79,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                   ,0x61b);
    iVar1 = 0;
  }
  else {
    if ((c->count == 0) && (c->bytes_left != 0)) {
      local_20 = 0;
      gost_imit_update(ctx,&local_20,8);
    }
    iVar1 = c->bytes_left;
    if ((long)iVar1 != 0) {
      if (iVar1 < 8) {
        memset(c->partial_block + iVar1,0,(ulong)(7 - iVar1) + 1);
      }
      mac_block_mesh(c,c->partial_block);
    }
    get_mac(c->buffer,c->dgst_size << 3,md);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int gost_imit_final(EVP_MD_CTX *ctx, unsigned char *md)
{
    struct ossl_gost_imit_ctx *c = EVP_MD_CTX_md_data(ctx);
    if (!c->key_set) {
        GOSTerr(GOST_F_GOST_IMIT_FINAL, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }
    if (c->count == 0 && c->bytes_left) {
        unsigned char buffer[8];
        memset(buffer, 0, 8);
        gost_imit_update(ctx, buffer, 8);
    }
    if (c->bytes_left) {
        int i;
        for (i = c->bytes_left; i < 8; i++) {
            c->partial_block[i] = 0;
        }
        mac_block_mesh(c, c->partial_block);
    }
    get_mac(c->buffer, 8 * c->dgst_size, md);
    return 1;
}